

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O2

newtRef NewtExpandPath(char *s)

{
  newtRef nVar1;
  char *pcVar2;
  char *local_20;
  
  local_20 = (char *)0x0;
  if (*s == '/') {
    pcVar2 = (char *)0x0;
    goto LAB_00104878;
  }
  pcVar2 = s;
  if (*s == '~') {
    s = NewtGetHomeDir(s,&local_20);
    if ((local_20 == (char *)0x0) || (local_20[1] == '\0')) {
      local_20 = (char *)0x0;
    }
    else {
      local_20 = local_20 + 1;
    }
    pcVar2 = local_20;
    if (s == (char *)0x0) goto LAB_00104849;
    pcVar2 = (char *)0x0;
  }
  else {
LAB_00104849:
    local_20 = pcVar2;
    s = getcwd((char *)0x0,0);
    pcVar2 = s;
  }
  if (local_20 != (char *)0x0) {
    s = NewtJoinPath(s,local_20,'/');
    NewtRelToAbsPath(s);
  }
LAB_00104878:
  nVar1 = NewtMakeString(s,false);
  if (local_20 != (char *)0x0) {
    free(s);
  }
  free(pcVar2);
  return nVar1;
}

Assistant:

newtRef NewtExpandPath(const char *	s)
{
    newtRefVar	r = kNewtRefUnbind;
    char *  subdir = NULL;
    char *  dir = NULL;
    char *  wd = NULL;
    char	sep;
    
    sep = NewtGetFileSeparator();
    
    if (*s == sep)
    {
        dir = (char *)s;
    }
#ifdef WIN32
    else if (isalpha(*s) && s[1] == ':')
    {
        dir = (char *)s;
    }
#endif
    else if (*s == '~')
    {
        dir = NewtGetHomeDir(s, &subdir);
        
        if (subdir != NULL && subdir[1])
            subdir++;
        else
            subdir = NULL;
    }
    else
    {
        subdir = (char *)s;
    }